

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expertInline.hpp
# Opt level: O2

void __thiscall LinearExpert::m_step(LinearExpert *this)

{
  Z *dst;
  XZ *pXVar1;
  Z *pZVar2;
  X *pXVar3;
  ZZ *pZVar4;
  Z *pZVar5;
  DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *this_00;
  Scalar __x;
  Scal SVar6;
  Scalar __x_00;
  Z meanZ;
  ZZ zz;
  X meanX;
  XZ xz;
  DenseStorage<double,__1,__1,__1,_0> *local_100;
  undefined1 local_f8 [16];
  DenseStorage<double,__1,__1,__1,_0> local_e8;
  X *local_d0;
  Matrix<double,__1,_1,_0,__1,_1> local_c8;
  undefined1 local_b8 [16];
  Matrix<double,__1,_1,_0,__1,_1> *local_a8;
  scalar_constant_op<double> local_a0;
  Z *local_98;
  scalar_constant_op<double> local_90;
  Z *local_88;
  DenseStorage<double,__1,__1,__1,_0> *local_80;
  XZ *local_78;
  variable_if_dynamic<long,__1> local_68;
  scalar_constant_op<double> local_58;
  DenseStorage<double,__1,__1,__1,_0> local_48;
  
  pZVar2 = &this->Sz;
  local_b8._8_8_ =
       (this->Sz).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  local_a0.m_other = this->Sh;
  local_b8._0_8_ = pZVar2;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_f8,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
              *)local_b8);
  pXVar3 = &this->Sx;
  local_b8._8_8_ =
       (this->Sx).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  local_a0.m_other = this->Sh;
  local_b8._0_8_ = pXVar3;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_c8,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
              *)local_b8);
  local_90.m_other = this->wNu;
  local_d0 = pXVar3;
  if ((local_90.m_other != 0.0) || (NAN(local_90.m_other))) {
    pZVar5 = &this->Nu0;
    local_68.m_value =
         (this->Sz).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    local_a0.m_other =
         (double)(this->Nu0).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_rows;
    local_58.m_other = this->Sh + local_90.m_other;
    dst = &this->Nu;
    local_88 = pZVar5;
    local_78 = (XZ *)pZVar2;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
              (dst,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    *)local_b8);
    pZVar4 = &this->Sigma;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>>
              (pZVar4,&this->Szz);
    local_a8 = (Matrix<double,__1,_1,_0,__1,_1> *)
               (this->mixture->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
               .m_storage.m_rows;
    local_90.m_other = (double)&this->mixture->Sigma;
    local_98 = (Z *)this->wSigma;
    Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator+=
              ((DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)pZVar4,
               (EigenBase<Eigen::DiagonalWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                *)local_b8);
    local_b8._8_8_ =
         (this->Nu0).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
    ;
    local_a0.m_other = this->wNu;
    local_e8.m_data = (double *)pZVar4;
    local_98 = pZVar5;
    local_88 = pZVar5;
    Eigen::NoAlias<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::MatrixBase>::operator+=
              ((NoAlias<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::MatrixBase> *)(local_f8 + 0x10),
               (MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_0>_>
                *)local_b8);
    local_a0.m_other = this->wNu + this->Sh;
    local_b8._8_8_ =
         (this->Nu).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    local_e8.m_data = (double *)pZVar4;
    local_98 = dst;
    local_88 = dst;
    Eigen::NoAlias<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::MatrixBase>::operator-=
              ((NoAlias<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::MatrixBase> *)(local_f8 + 0x10),
               (MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_0>_>
                *)local_b8);
    local_b8._0_8_ = (double)this->d + this->Sh + this->wSigma + 2.0;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator/=
              ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)pZVar4,(Scalar *)local_b8);
  }
  else {
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
              (&this->Nu,(Matrix<double,__1,_1,_0,__1,_1> *)local_f8);
    pZVar4 = &this->Sigma;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>>
              (pZVar4,&this->Szz);
    local_a8 = (Matrix<double,__1,_1,_0,__1,_1> *)
               (this->mixture->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
               .m_storage.m_rows;
    local_90.m_other = (double)&this->mixture->Sigma;
    local_98 = (Z *)this->wSigma;
    Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator+=
              ((DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)pZVar4,
               (EigenBase<Eigen::DiagonalWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                *)local_b8);
    local_e8.m_data = (double *)pZVar4;
    local_b8._0_8_ = pZVar2;
    local_b8._8_8_ = &this->Nu;
    Eigen::NoAlias<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::MatrixBase>::operator-=
              ((NoAlias<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::MatrixBase> *)(local_f8 + 0x10),
               (MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_0>_>
                *)local_b8);
    local_b8._0_8_ = (double)this->d + this->Sh + this->wSigma + 1.0;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator/=
              ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)pZVar4,(Scalar *)local_b8);
  }
  local_b8._0_8_ = &this->Sigma;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Inverse<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            (&this->invSigma,(Inverse<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_b8);
  __x = Eigen::internal::determinant_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1>::run
                  (&this->invSigma);
  if (__x < 0.0) {
    SVar6 = sqrt(__x);
  }
  else {
    SVar6 = SQRT(__x);
  }
  this->sqrtDetInvSigma = SVar6;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,__1,_0> *)(local_f8 + 0x10),
             (DenseStorage<double,__1,__1,__1,_0> *)&this->Szz);
  local_a8 = (Matrix<double,__1,_1,_0,__1,_1> *)(long)this->d;
  local_98 = (Z *)this->wLambda;
  local_80 = (DenseStorage<double,__1,__1,__1,_0> *)0x3ff0000000000000;
  this_00 = (DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)(local_f8 + 0x10);
  local_90.m_other = (double)local_a8;
  Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator+=
            (this_00,(EigenBase<Eigen::DiagonalWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>
                      *)local_b8);
  local_b8._0_8_ = local_f8;
  local_b8._8_8_ = pZVar2;
  local_48.m_data = (double *)this_00;
  Eigen::NoAlias<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::MatrixBase>::operator-=
            ((NoAlias<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::MatrixBase> *)&local_48,
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_0>_>
              *)local_b8);
  local_b8._0_8_ = this_00;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Inverse<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            (&this->varLambda,(Inverse<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_b8);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            (&local_48,(DenseStorage<double,__1,__1,__1,_0> *)&this->Sxz);
  local_100 = &local_48;
  local_b8._0_8_ = (PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_c8;
  local_b8._8_8_ = pZVar2;
  Eigen::NoAlias<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::MatrixBase>::operator-=
            ((NoAlias<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::MatrixBase> *)&local_100,
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_0>_>
              *)local_b8);
  pXVar1 = &this->Lambda;
  local_100 = (DenseStorage<double,__1,__1,__1,_0> *)pXVar1;
  local_b8._0_8_ = &local_48;
  local_b8._8_8_ = &this->varLambda;
  Eigen::NoAlias<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::MatrixBase>::operator=
            ((NoAlias<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::MatrixBase> *)&local_100,
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
              *)local_b8);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
            (&this->Mu,&local_c8);
  local_b8._8_8_ = &this->Nu;
  local_a8 = (Matrix<double,__1,_1,_0,__1,_1> *)local_f8;
  local_100 = (DenseStorage<double,__1,__1,__1,_0> *)&this->Mu;
  local_b8._0_8_ = pXVar1;
  Eigen::NoAlias<Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::MatrixBase>::operator+=
            ((NoAlias<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::MatrixBase> *)&local_100,
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_0>_>
              *)local_b8);
  local_b8._8_8_ =
       (this->mixture->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
       .m_rows;
  local_98 = &this->mixture->Psi;
  local_a0.m_other = this->wPsi;
  pXVar3 = &this->Psi;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
            (pXVar3,(CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                     *)local_b8);
  local_b8._8_8_ = &this->Sxx;
  local_a0.m_other = (double)local_d0;
  local_100 = (DenseStorage<double,__1,__1,__1,_0> *)pXVar3;
  local_a8 = &local_c8;
  local_80 = &local_48;
  local_78 = pXVar1;
  Eigen::NoAlias<Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::MatrixBase>::operator+=
            ((NoAlias<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::MatrixBase> *)&local_100,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::PartialReduxExpr<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::member_sum<double,_double>,_1>_>_>
              *)local_b8);
  local_b8._0_8_ = this->wPsi + this->Sh + 2.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator/=
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)pXVar3,(Scalar *)local_b8);
  local_b8._0_8_ = pXVar3;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_inverse_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
            (&this->invPsi,
             (CwiseUnaryOp<Eigen::internal::scalar_inverse_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
              *)local_b8);
  __x_00 = Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::prod
                     ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->invPsi);
  if (__x_00 < 0.0) {
    SVar6 = sqrt(__x_00);
  }
  else {
    SVar6 = SQRT(__x_00);
  }
  this->sqrtDetInvPsi = SVar6;
  this->recompute = true;
  free(local_48.m_data);
  free(local_e8.m_data);
  free(local_c8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free((void *)local_f8._0_8_);
  return;
}

Assistant:

EXPERT_CLASS_TEMPLATE
void LINEAR_EXPERT_base::m_step()
{
    Z meanZ = Sz / Sh;
    X meanX = Sx / Sh;

    if( wNu == 0.0 )
    {
        Nu = meanZ;
        Sigma = Szz;
        Sigma += (wSigma*mixture->getSigma()).asDiagonal();
        Sigma.noalias() -= Sz*Nu.transpose();
        Sigma /= (Sh + wSigma + d + 1.0);
    }
    else
    {
        Nu = (wNu * Nu0 + Sz) / (wNu + Sh);
        Sigma = Szz;
        Sigma += (wSigma*mixture->getSigma()).asDiagonal();
        Sigma.noalias() += (wNu*Nu0)*Nu0.transpose();
        Sigma.noalias() -= ((wNu+Sh)*Nu)*Nu.transpose();
        Sigma /= (Sh + wSigma + d + 2.0);
    }
	invSigma = Sigma.inverse();
    sqrtDetInvSigma = sqrt(invSigma.determinant());

    ZZ zz = Szz;
    zz += (wLambda * Z::Ones(d)).asDiagonal();
    zz.noalias() -= meanZ*Sz.transpose();
    varLambda = zz.inverse();
    XZ xz = Sxz;
    xz.noalias() -= meanX*Sz.transpose();
    Lambda.noalias() = xz * varLambda;
    Mu = meanX;
    Mu.noalias() += Lambda * (Nu - meanZ);

    Psi = wPsi * mixture->getPsi();
    Psi.noalias() += Sxx - meanX.cwiseProduct(Sx) - xz.cwiseProduct(Lambda).rowwise().sum();
    Psi /= (wPsi + Sh + 2.0 );
    invPsi = Psi.cwiseInverse();
    sqrtDetInvPsi = sqrt(invPsi.prod());

    recompute = true;
}